

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O2

FailStep failStepFromString(string *str)

{
  bool bVar1;
  FailStep FVar2;
  runtime_error *this;
  
  bVar1 = std::operator==(str,"none");
  FVar2 = None;
  if (!bVar1) {
    bVar1 = std::operator==(str,"parsing");
    if (bVar1) {
      FVar2 = Parsing;
    }
    else {
      bVar1 = std::operator==(str,"semantic_analysis");
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Unknown fail step provided");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      FVar2 = SemanticAnalysis;
    }
  }
  return FVar2;
}

Assistant:

FailStep failStepFromString(const std::string & str) {
  if (str == "none") {
    return FailStep::None;
  }

  if (str == "parsing") {
    return FailStep::Parsing;
  }

  if (str == "semantic_analysis") {
    return FailStep::SemanticAnalysis;
  }

  throw std::runtime_error("Unknown fail step provided");
}